

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::BasicCopyTexImageCubeCase::createTexture(BasicCopyTexImageCubeCase *this)

{
  ChannelOrder CVar1;
  BasicCopyTexImageCubeCase *pBVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  Context *pCVar8;
  NotSupportedError *this_00;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int height;
  ContextWrapper *this_01;
  long lVar12;
  deUint32 tex;
  BasicCopyTexImageCubeCase *local_1c0;
  ulong local_1b8;
  Random rnd;
  undefined1 *local_1a0;
  float local_198;
  Vec3 local_194;
  GradientShader shader;
  
  local_1c0 = this;
  iVar3 = (*((this->super_TextureSpecCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[4])();
  pBVar2 = local_1c0;
  lVar12 = CONCAT44(extraout_var,iVar3);
  uVar9 = 0;
  if ((0 < *(int *)(lVar12 + 8)) && (0 < *(int *)(lVar12 + 0xc))) {
    uVar9 = (uint)(0 < *(int *)(lVar12 + 0x10));
  }
  local_1b8 = CONCAT44(local_1b8._4_4_,uVar9);
  CVar1 = (local_1c0->super_TextureSpecCase).m_texFormat.order;
  uVar9 = (local_1c0->super_TextureSpecCase).m_width;
  uVar11 = 0x20;
  if (uVar9 != 0) {
    uVar11 = 0x1f;
    if (uVar9 != 0) {
      for (; uVar9 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar11 = uVar11 ^ 0x1f;
  }
  iVar3 = *(int *)(lVar12 + 0x14);
  uVar9 = 1;
  if (((local_1c0->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar9 = 0x20 - uVar11;
  }
  tex = 0;
  dVar4 = deStringHash((local_1c0->super_TextureSpecCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  GradientShader::GradientShader(&shader);
  this_01 = &(pBVar2->super_TextureSpecCase).super_ContextWrapper;
  pCVar8 = sglr::ContextWrapper::getCurrentContext(this_01);
  dVar4 = (*pCVar8->_vptr_Context[0x75])(pCVar8);
  if ((CVar1 == A || (local_1b8 & 1) != 0) &&
     ((RGBA < CVar1 || (0xedU >> ((byte)CVar1 & 0x1f) & 1) != 0) || 0 < iVar3)) {
    pCVar8 = sglr::ContextWrapper::getCurrentContext(this_01);
    local_194.m_data[0] = -1.0;
    local_194.m_data[1] = -1.0;
    local_194.m_data[2] = 0.0;
    local_1a0 = &DAT_3f8000003f800000;
    local_198 = 0.0;
    sglr::drawQuad(pCVar8,dVar4,&local_194,(Vec3 *)&local_1a0);
    sglr::ContextWrapper::glGenTextures(this_01,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_01,0x8513,tex);
    if (uVar9 != 0) {
      uVar10 = 0;
      do {
        iVar3 = (local_1c0->super_TextureSpecCase).m_width >> ((byte)uVar10 & 0x1f);
        if (iVar3 < 2) {
          iVar3 = 1;
        }
        height = (local_1c0->super_TextureSpecCase).m_height >> ((byte)uVar10 & 0x1f);
        if (height < 2) {
          height = 1;
        }
        lVar12 = 0;
        local_1b8 = uVar10;
        do {
          iVar5 = sglr::ContextWrapper::getWidth(this_01);
          dVar4 = deRandom_getUint32(&rnd.m_rnd);
          iVar6 = sglr::ContextWrapper::getHeight(this_01);
          dVar7 = deRandom_getUint32(&rnd.m_rnd);
          sglr::ContextWrapper::glCopyTexImage2D
                    (this_01,*(deUint32 *)((long)&s_cubeMapFaces + lVar12),(int)local_1b8,
                     local_1c0->m_internalFormat,dVar4 % ((iVar5 - iVar3) + 1U),
                     dVar7 % ((iVar6 - height) + 1U),iVar3,height,0);
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x18);
        uVar11 = (int)local_1b8 + 1;
        uVar10 = (ulong)uVar11;
      } while (uVar11 != uVar9);
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Copying from current framebuffer is not supported",
             glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
             ,0x53b);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= m_texFormat;
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		int							numLevels		= (m_flags & MIPMAPS) ? deLog2Floor32(m_width)+1 : 1;
		deUint32					tex				= 0;
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader;
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		// Fill render target with gradient.
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int levelW = de::max(1, m_width >> ndx);
			int levelH = de::max(1, m_height >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int x = rnd.getInt(0, getWidth()	- levelW);
				int y = rnd.getInt(0, getHeight()	- levelH);

				glCopyTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, x, y, levelW, levelH, 0);
			}
		}
	}